

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O3

OSMesaContext glfwGetOSMesaContext(GLFWwindow *handle)

{
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x1f0) != 0) {
      return *(OSMesaContext *)(handle + 0x298);
    }
    code = 0x1000a;
  }
  _glfwInputError(code,(char *)0x0);
  return (OSMesaContext)0x0;
}

Assistant:

GLFWAPI OSMesaContext glfwGetOSMesaContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return NULL;
    }

    return window->context.osmesa.handle;
}